

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

bool __thiscall Parser::checkEquLabel(Parser *this)

{
  bool bVar1;
  Token *token;
  Token *pTVar2;
  Identifier *symbol;
  StringLiteral *this_00;
  string *value_00;
  StringLiteral *value;
  Identifier *name;
  int pos;
  Token *start;
  Parser *this_local;
  
  updateFileInfo(this);
  token = peekToken(this,0);
  if (token->type == Identifier) {
    name._4_4_ = 1;
    pTVar2 = peekToken(this,1);
    if (pTVar2->type == Colon) {
      name._4_4_ = 2;
    }
    pTVar2 = peekToken(this,name._4_4_);
    if ((pTVar2->type == Equ) && (pTVar2 = peekToken(this,name._4_4_ + 1), pTVar2->type == EquValue)
       ) {
      pTVar2 = peekToken(this,0);
      symbol = Token::identifierValue(pTVar2);
      pTVar2 = peekToken(this,name._4_4_ + 1);
      this_00 = Token::stringValue(pTVar2);
      eatTokens(this,name._4_4_ + 2);
      bVar1 = isInsideTrueBlock(this);
      if (!bVar1) {
        return true;
      }
      bVar1 = isInsideUnknownBlock(this);
      if (bVar1) {
        printError<>(this,token,"equ not allowed inside of block with non-trivial condition");
        return true;
      }
      if ((this->initializingMacro & 1U) != 0) {
        std::set<Identifier,_std::less<Identifier>,_std::allocator<Identifier>_>::insert
                  (&this->macroLabels,symbol);
        return true;
      }
      bVar1 = SymbolTable::isValidSymbolName(symbol);
      if (!bVar1) {
        printError<Identifier>(this,token,"Invalid equation name \"%s\"",symbol);
        return true;
      }
      bVar1 = SymbolTable::symbolExists
                        (&Global.symbolTable,symbol,Global.FileInfo.FileNum,Global.Section);
      if (!bVar1) {
        value_00 = StringLiteral::string_abi_cxx11_(this_00);
        addEquation(this,token,symbol,value_00);
        return true;
      }
      printError<Identifier>(this,token,"Equation name \"%s\" already defined",symbol);
      return true;
    }
  }
  return false;
}

Assistant:

bool Parser::checkEquLabel()
{
	updateFileInfo();

	const Token& start = peekToken();
	if (start.type == TokenType::Identifier)
	{
		int pos = 1;
		if (peekToken(pos).type == TokenType::Colon)
			pos++;

		if (peekToken(pos).type == TokenType::Equ &&
			peekToken(pos+1).type == TokenType::EquValue)
		{
			const Identifier &name = peekToken(0).identifierValue();
			const StringLiteral &value = peekToken(pos+1).stringValue();
			eatTokens(pos+2);

			// skip the equ if it's inside a false conditional block
			if (!isInsideTrueBlock())
				return true;

			// equs can't be inside blocks whose condition can only be
			// evaluated during validation
			if (isInsideUnknownBlock())
			{
				printError(start, "equ not allowed inside of block with non-trivial condition");
				return true;
			}

			// when parsing a macro, just remember the equ name
			if (initializingMacro)
			{
				macroLabels.insert(name);
				return true;
			}

			if (!Global.symbolTable.isValidSymbolName(name))
			{
				printError(start, "Invalid equation name \"%s\"",name);
				return true;
			}

			if (Global.symbolTable.symbolExists(name,Global.FileInfo.FileNum,Global.Section))
			{
				printError(start, "Equation name \"%s\" already defined",name);
				return true;
			}

			addEquation(start,name,value.string());
			return true;
		}
	}

	return false;
}